

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O2

InsertOrderedSet<CFG::Block_*> * __thiscall
wasm::InsertOrderedMap<CFG::Block_*,_wasm::InsertOrderedSet<CFG::Block_*>_>::operator[]
          (InsertOrderedMap<CFG::Block_*,_wasm::InsertOrderedSet<CFG::Block_*>_> *this,Block **k)

{
  pair<std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>,_bool>
  pVar1;
  undefined1 local_b8 [8];
  pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_> kv;
  __node_base_ptr p_Stack_30;
  _List_node_base local_28;
  undefined8 local_18;
  
  kv.second.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node.
  _M_size = (size_t)&p_Stack_30;
  p_Stack_30 = (__node_base_ptr)0x0;
  local_28._M_next = &local_28;
  local_18 = 0;
  local_28._M_prev = local_28._M_next;
  std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>::
  pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>,_true>
            ((pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_> *)local_b8,k,
             (InsertOrderedSet<CFG::Block_*> *)
             &kv.second.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
              _M_node._M_size);
  InsertOrderedSet<CFG::Block_*>::~InsertOrderedSet
            ((InsertOrderedSet<CFG::Block_*> *)
             &kv.second.List.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
              _M_node._M_size);
  pVar1 = insert(this,(pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_> *)local_b8);
  InsertOrderedSet<CFG::Block_*>::~InsertOrderedSet((InsertOrderedSet<CFG::Block_*> *)&kv);
  return (InsertOrderedSet<CFG::Block_*> *)&pVar1.first._M_node._M_node[1]._M_prev;
}

Assistant:

T& operator[](const Key& k) {
    std::pair<const Key, T> kv = {k, {}};
    return insert(kv).first->second;
  }